

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

LengthDisplay
ON_DimStyle::LengthDisplayFromUnitsAndFormat
          (LengthUnitSystem dimunits,OBSOLETE_length_format lengthformat)

{
  LengthDisplay LVar1;
  
  LVar1 = FeetAndInches;
  if ((lengthformat & ~Fractional) != FeetInches) {
    LVar1 = ModelUnits;
    switch(dimunits) {
    case Millimeters:
      return Millmeters;
    case Centimeters:
      return Centimeters;
    case Meters:
      return Meters;
    case Kilometers:
      return Kilometers;
    case Inches:
      LVar1 = InchesDecimal;
      if (lengthformat == Fractional) {
        LVar1 = InchesFractional;
      }
      return LVar1;
    case Feet:
      return FeetDecimal;
    case Miles:
      return Miles;
    }
  }
  return LVar1;
}

Assistant:

ON_DimStyle::LengthDisplay ON_DimStyle::LengthDisplayFromUnitsAndFormat(
  ON::LengthUnitSystem dimunits, 
  ON_DimStyle::OBSOLETE_length_format lengthformat)
{
  ON_DimStyle::LengthDisplay display = ON_DimStyle::LengthDisplay::ModelUnits;

  if (
    ON_DimStyle::OBSOLETE_length_format::FeetInches == lengthformat
    || ON_DimStyle::OBSOLETE_length_format::FeetDecimalInches == lengthformat
    )
  {
    display = ON_DimStyle::LengthDisplay::FeetAndInches;
  }
  else
  {
    switch (dimunits)
    {
    case ON::LengthUnitSystem::Millimeters:
      display = ON_DimStyle::LengthDisplay::Millmeters;
      break;
    case ON::LengthUnitSystem::Centimeters:
      display = ON_DimStyle::LengthDisplay::Centimeters;
      break;
    case ON::LengthUnitSystem::Meters:
      display = ON_DimStyle::LengthDisplay::Meters;
      break;
    case ON::LengthUnitSystem::Kilometers:
      display = ON_DimStyle::LengthDisplay::Kilometers;
      break;
    case ON::LengthUnitSystem::Miles:
      display = ON_DimStyle::LengthDisplay::Miles;
      break;
    case ON::LengthUnitSystem::Inches:
      if (ON_DimStyle::OBSOLETE_length_format::Fractional == lengthformat)
        display = ON_DimStyle::LengthDisplay::InchesFractional;
      else
        display = ON_DimStyle::LengthDisplay::InchesDecimal;
      break;
    case ON::LengthUnitSystem::Feet:
      display = ON_DimStyle::LengthDisplay::FeetDecimal;
      break;
    default:
      break;
    }
  }
  return display;
}